

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O2

int __thiscall CEditor::GetLineDistance(CEditor *this)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = this->m_ZoomLevel;
  if ((int)uVar1 < 0x65) {
    iVar2 = 0x10;
  }
  else if (uVar1 < 0xfb) {
    iVar2 = 0x20;
  }
  else {
    if (0x1c2 < uVar1) {
      iVar2 = 0x80;
      if (0x352 < uVar1) {
        iVar2 = (uint)(0x60e < uVar1) * 0x100 + 0x100;
      }
      return iVar2;
    }
    iVar2 = 0x40;
  }
  return iVar2;
}

Assistant:

int CEditor::GetLineDistance() const
{
	int LineDistance = 512;

	if(m_ZoomLevel <= 100)
		LineDistance = 16;
	else if(m_ZoomLevel <= 250)
		LineDistance = 32;
	else if(m_ZoomLevel <= 450)
		LineDistance = 64;
	else if(m_ZoomLevel <= 850)
		LineDistance = 128;
	else if(m_ZoomLevel <= 1550)
		LineDistance = 256;

	return LineDistance;
}